

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::EntryPointInfo::RecordNativeMap(EntryPointInfo *this,uint32 nativeOffset,uint32 statementIndex)

{
  Type *this_00;
  Type *pTVar1;
  int iVar2;
  uint32 uVar3;
  Type pNVar4;
  NativeEntryPointData *pNVar5;
  Type *pTVar6;
  
  pNVar5 = GetNativeEntryPointData(this);
  this_00 = &pNVar5->nativeOffsetMaps;
  iVar2 = (pNVar5->nativeOffsetMaps).
          super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
          .count;
  if (iVar2 != 0) {
    pTVar6 = JsUtil::
             List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_00,iVar2 + -1);
    uVar3 = (pTVar6->nativeOffsetSpan).begin;
    if (uVar3 == (pTVar6->nativeOffsetSpan).end) {
      if (pTVar6->statementIndex == statementIndex) {
        return;
      }
      if (uVar3 == nativeOffset) {
        if (statementIndex != 0xffffffff) {
          pTVar6->statementIndex = statementIndex;
          return;
        }
        JsUtil::
        List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::RemoveAtEnd(this_00);
        return;
      }
      (pTVar6->nativeOffsetSpan).end = nativeOffset;
    }
  }
  if (statementIndex != 0xffffffff) {
    JsUtil::
    List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(this_00,0);
    pNVar4 = (pNVar5->nativeOffsetMaps).
             super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
             .buffer;
    iVar2 = (pNVar5->nativeOffsetMaps).
            super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
            .count;
    pNVar4[iVar2].statementIndex = statementIndex;
    pNVar4[iVar2].nativeOffsetSpan.begin = nativeOffset;
    pNVar4[iVar2].nativeOffsetSpan.end = nativeOffset;
    pTVar1 = &(pNVar5->nativeOffsetMaps).
              super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
              .count;
    *pTVar1 = *pTVar1 + 1;
  }
  return;
}

Assistant:

void
    EntryPointInfo::RecordNativeMap(uint32 nativeOffset, uint32 statementIndex)
    {
        auto& nativeOffsetMaps = this->GetNativeEntryPointData()->GetNativeOffsetMaps();
        int count = nativeOffsetMaps.Count();
        if (count)
        {
            NativeEntryPointData::NativeOffsetMap* previous = &nativeOffsetMaps.Item(count-1);
            // Check if the range is still not finished.
            if (previous->nativeOffsetSpan.begin == previous->nativeOffsetSpan.end)
            {
                if (previous->statementIndex == statementIndex)
                {
                    // If the statement index is the same, we can continue with the previous range
                    return;
                }

                // If the range is empty, replace the previous range.
                if ((uint32)previous->nativeOffsetSpan.begin == nativeOffset)
                {
                    if (statementIndex == Js::Constants::NoStatementIndex)
                    {
                        nativeOffsetMaps.RemoveAtEnd();
                    }
                    else
                    {
                        previous->statementIndex = statementIndex;
                    }
                    return;
                }

                // Close the previous range
                previous->nativeOffsetSpan.end = nativeOffset;
            }
        }

        if (statementIndex == Js::Constants::NoStatementIndex)
        {
            // We do not explicitly record the offsets that do not map to user code.
            return;
        }

        NativeEntryPointData::NativeOffsetMap map;
        map.statementIndex = statementIndex;
        map.nativeOffsetSpan.begin = nativeOffset;
        map.nativeOffsetSpan.end = nativeOffset;

        nativeOffsetMaps.Add(map);
    }